

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
  *this_00;
  Fad<double> *pFVar7;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  double *pdVar10;
  value_type vVar11;
  
  this_00 = &this->right_->fadexpr_;
  pFVar7 = (this->left_->fadexpr_).right_;
  pdVar10 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar10 = (pFVar7->dx_).ptr_to_data + i;
  }
  pFVar8 = (this_00->left_->fadexpr_).left_;
  pFVar9 = (this_00->left_->fadexpr_).right_;
  dVar1 = (pFVar8->fadexpr_).left_.constant_;
  dVar2 = ((pFVar8->fadexpr_).right_)->val_;
  dVar3 = (pFVar9->fadexpr_).left_.constant_;
  dVar4 = ((pFVar9->fadexpr_).right_)->val_;
  dVar5 = this_00->right_->val_;
  dVar6 = *pdVar10;
  vVar11 = FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
           ::dx(this_00,i);
  return vVar11 * ((this->left_->fadexpr_).left_.constant_ + ((this->left_->fadexpr_).right_)->val_)
         + (((dVar1 + dVar2) - dVar3 * dVar4) - dVar5) * dVar6;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}